

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O3

void __thiscall Writer::writeBlock(Writer *this,Block *block)

{
  pointer ppEVar1;
  bool bVar2;
  pointer ppEVar3;
  string local_50;
  
  CWriter::indent(&this->wr,1);
  CWriter::startBlock(&this->wr,&block->blockName);
  ppEVar3 = (block->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (block->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar3 != ppEVar1) {
    do {
      CWriter::indent(&this->wr,1);
      (*(*ppEVar3)->_vptr_Expr[2])(*ppEVar3,&this->ew);
      bVar2 = IfExpr::classof(*ppEVar3);
      if (!bVar2) {
        bVar2 = SwitchExpr::classof(*ppEVar3);
        if (!bVar2) {
          bVar2 = ExprList::classof(*ppEVar3);
          if (!bVar2) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,";","");
            CWriter::line(&this->wr,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      ppEVar3 = ppEVar3 + 1;
    } while (ppEVar3 != ppEVar1);
  }
  return;
}

Assistant:

void Writer::writeBlock(const Block* block) {
    wr.indent(1);
    wr.startBlock(block->blockName);

    for (const auto& expr : block->expressions) {
        wr.indent(1);
        expr->accept(ew);
        if (!llvm::isa<IfExpr>(expr) && !llvm::isa<SwitchExpr>(expr) && !llvm::isa<ExprList>(expr)) {
            wr.line(";");
        }
    }
}